

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::SimpleFieldComparator::CompareDoubleOrFloat<double>
          (SimpleFieldComparator *this,FieldDescriptor *field,double value_1,double value_2)

{
  bool bVar1;
  pointer prVar2;
  byte bVar3;
  Tolerance *pTVar4;
  bool bVar5;
  double fraction;
  double margin;
  iterator it;
  iterator local_48;
  iterator local_38;
  
  if ((value_1 == value_2) && (!NAN(value_1) && !NAN(value_2))) {
    return true;
  }
  bVar5 = this->float_comparison_ != EXACT;
  bVar3 = (NAN(value_2) && NAN(value_1)) & this->treat_nan_as_equal_;
  if (!bVar5 || bVar3 != 0) {
    return (bool)(bVar5 | bVar3);
  }
  bVar5 = this->has_default_tolerance_;
  local_48.ctrl_ = (ctrl_t *)field;
  local_38 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
             ::find<google::protobuf::FieldDescriptor_const*>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::SimpleFieldComparator::Tolerance>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
                         *)&this->map_tolerance_,
                        (key_arg<const_google::protobuf::FieldDescriptor_*> *)&local_48);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
              *)&this->map_tolerance_);
  local_48.ctrl_ = (ctrl_t *)0x0;
  bVar1 = absl::lts_20250127::container_internal::operator!=(&local_38,&local_48);
  if (bVar1) {
    prVar2 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
             ::iterator::operator->(&local_38);
    pTVar4 = &prVar2->second;
  }
  else {
    if (bVar5 == false) {
      if ((ABS(value_1) <= 7.105427357601002e-15) && (ABS(value_2) <= 7.105427357601002e-15)) {
        return true;
      }
      fraction = 7.105427357601002e-15;
      margin = 7.105427357601002e-15;
      goto LAB_00279b43;
    }
    pTVar4 = &this->default_tolerance_;
  }
  fraction = pTVar4->fraction;
  margin = pTVar4->margin;
LAB_00279b43:
  bVar5 = anon_unknown_4::WithinFractionOrMargin<double>(value_1,value_2,fraction,margin);
  return bVar5;
}

Assistant:

bool SimpleFieldComparator::CompareDoubleOrFloat(const FieldDescriptor& field,
                                                 T value_1, T value_2) {
  if (value_1 == value_2) {
    // Covers +inf and -inf (which are not within margin or fraction of
    // themselves), and is a shortcut for finite values.
    return true;
  } else if (float_comparison_ == EXACT) {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    return false;
  } else {
    if (treat_nan_as_equal_ && std::isnan(value_1) && std::isnan(value_2)) {
      return true;
    }
    // float_comparison_ == APPROXIMATE covers two use cases.
    Tolerance* tolerance = nullptr;
    if (has_default_tolerance_) tolerance = &default_tolerance_;

    auto it = map_tolerance_.find(&field);
    if (it != map_tolerance_.end()) {
      tolerance = &it->second;
    }

    if (tolerance != nullptr) {
      // Use user-provided fraction and margin. Since they are stored as
      // doubles, we explicitly cast them to types of values provided. This
      // is very likely to fail if provided values are not numeric.
      return WithinFractionOrMargin(value_1, value_2,
                                    static_cast<T>(tolerance->fraction),
                                    static_cast<T>(tolerance->margin));
    } else {
      if (std::fabs(value_1) <= Epsilon<T>::value &&
          std::fabs(value_2) <= Epsilon<T>::value) {
        return true;
      }
      return WithinFractionOrMargin(value_1, value_2, Epsilon<T>::value,
                                    Epsilon<T>::value);
    }
  }
}